

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

opj_image_t *
rawtoimage_common(char *filename,opj_cparameters_t *parameters,raw_cparameters_t *raw_cp,
                 OPJ_BOOL big_endian)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  OPJ_BOOL OVar6;
  OPJ_UINT32 OVar7;
  OPJ_UINT32 OVar8;
  raw_comp_cparameters_t *prVar9;
  ushort uVar10;
  ushort uVar11;
  int iVar12;
  FILE *__stream;
  int *piVar13;
  opj_image_t *poVar14;
  size_t sVar15;
  ulong uVar16;
  int *piVar17;
  int *piVar18;
  int *piVar19;
  ulong uVar20;
  uchar value;
  uchar temp2;
  uchar temp1;
  unsigned_short ch;
  byte local_63;
  byte local_62;
  byte local_61;
  int *local_60;
  raw_cparameters_t *local_58;
  int *local_50;
  int *local_48;
  undefined1 local_3a [2];
  opj_cparameters_t *local_38;
  
  local_48 = (int *)CONCAT44(local_48._4_4_,big_endian);
  local_58 = raw_cp;
  if ((raw_cp->rawBitDepth & raw_cp->rawHeight & raw_cp->rawComp & raw_cp->rawWidth) == 0) {
    iVar1 = parameters->subsampling_dx;
    iVar2 = parameters->subsampling_dy;
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      rawtoimage_common_cold_6();
    }
    else {
      uVar3 = local_58->rawComp;
      piVar17 = (int *)(ulong)uVar3;
      iVar12 = 2;
      if ((piVar17 != (int *)0x1) && (iVar12 = -1, 2 < (int)uVar3)) {
        iVar12 = 3;
        if (parameters->tcp_mct != '\0') {
          iVar12 = (uint)(parameters->tcp_mct != '\x02') * 2 + -1;
        }
      }
      local_60 = (int *)CONCAT44(local_60._4_4_,iVar12);
      iVar12 = local_58->rawWidth;
      uVar4 = local_58->rawHeight;
      local_38 = parameters;
      piVar13 = (int *)calloc((size_t)piVar17,0x24);
      if (piVar13 == (int *)0x0) {
        rawtoimage_common_cold_5();
      }
      else {
        if (0 < (int)uVar3) {
          iVar5 = local_58->rawBitDepth;
          OVar6 = local_58->rawSigned;
          prVar9 = local_58->rawComps;
          piVar18 = (int *)0x0;
          piVar19 = piVar13;
          do {
            piVar19[6] = iVar5;
            piVar19[8] = OVar6;
            *piVar19 = prVar9[(long)piVar18].dx * iVar1;
            piVar19[1] = prVar9[(long)piVar18].dy * iVar2;
            piVar19[2] = iVar12;
            piVar19[3] = uVar4;
            piVar18 = (int *)((long)piVar18 + 1);
            piVar19 = piVar19 + 9;
          } while (piVar17 != piVar18);
        }
        uVar16 = (ulong)local_60 & 0xffffffff;
        local_60 = piVar13;
        local_50 = piVar17;
        poVar14 = (opj_image_t *)opj_image_create(piVar17,piVar13,uVar16);
        free(local_60);
        if (poVar14 != (opj_image_t *)0x0) {
          OVar7 = local_38->image_offset_x0;
          poVar14->x0 = OVar7;
          OVar8 = local_38->image_offset_y0;
          poVar14->y0 = OVar8;
          poVar14->x1 = OVar7 + (iVar12 + -1) * iVar1 + 1;
          poVar14->y1 = (uVar4 - 1) * iVar2 + OVar8 + 1;
          if (local_58->rawBitDepth < 9) {
            local_63 = 0;
            local_60 = (int *)(ulong)uVar4;
            if (0 < (int)local_50) {
              local_60 = (int *)(ulong)(uVar4 * iVar12);
              piVar17 = (int *)0x0;
              do {
                uVar16 = (long)((ulong)(uint)((int)local_60 >> 0x1f) << 0x20 |
                               (ulong)local_60 & 0xffffffff) /
                         (long)(local_58->rawComps[(long)piVar17].dy *
                               local_58->rawComps[(long)piVar17].dx);
                local_48 = piVar17;
                if (0 < (int)uVar16) {
                  uVar20 = 0;
                  do {
                    sVar15 = fread(&local_63,1,1,__stream);
                    if (sVar15 == 0) {
                      rawtoimage_common_cold_4();
                      return (opj_image_t *)0x0;
                    }
                    uVar3 = (int)(char)local_63;
                    if (local_58->rawSigned == 0) {
                      uVar3 = (uint)local_63;
                    }
                    poVar14->comps[(long)piVar17].data[uVar20] = uVar3;
                    uVar20 = uVar20 + 1;
                  } while ((uVar16 & 0xffffffff) != uVar20);
                }
                piVar17 = (int *)((long)local_48 + 1);
              } while (piVar17 != local_50);
            }
          }
          else {
            if (0x10 < (uint)local_58->rawBitDepth) {
              rawtoimage_common_cold_2();
              return (opj_image_t *)0x0;
            }
            if (0 < (int)local_50) {
              piVar17 = (int *)0x0;
              do {
                uVar16 = (long)(int)(uVar4 * iVar12) /
                         (long)(local_58->rawComps[(long)piVar17].dy *
                               local_58->rawComps[(long)piVar17].dx);
                local_60 = piVar17;
                if (0 < (int)uVar16) {
                  uVar20 = 0;
                  do {
                    sVar15 = fread(&local_61,1,1,__stream);
                    if ((sVar15 == 0) || (sVar15 = fread(&local_62,1,1,__stream), sVar15 == 0)) {
                      fwrite("Error reading raw file. End of file probably reached.\n",0x36,1,
                             _stderr);
                      opj_image_destroy(poVar14);
                      goto LAB_0010c907;
                    }
                    uVar10 = (ushort)local_61;
                    uVar11 = (ushort)local_62;
                    if ((int)local_48 == 0) {
                      uVar10 = (ushort)local_62;
                      uVar11 = (ushort)local_61;
                    }
                    uVar11 = uVar11 | uVar10 << 8;
                    uVar3 = (uint)uVar11;
                    if (local_58->rawSigned != 0) {
                      uVar3 = (int)(short)uVar11;
                    }
                    poVar14->comps[(long)piVar17].data[uVar20] = uVar3;
                    uVar20 = uVar20 + 1;
                  } while ((uVar16 & 0xffffffff) != uVar20);
                }
                piVar17 = (int *)((long)local_60 + 1);
              } while (piVar17 != local_50);
            }
          }
          sVar15 = fread(local_3a,1,1,__stream);
          if (sVar15 != 0) {
            rawtoimage_common_cold_3();
          }
          fclose(__stream);
          return poVar14;
        }
LAB_0010c907:
        fclose(__stream);
      }
    }
  }
  else {
    rawtoimage_common_cold_1();
  }
  return (opj_image_t *)0x0;
}

Assistant:

static opj_image_t* rawtoimage_common(const char *filename,
                                      opj_cparameters_t *parameters, raw_cparameters_t *raw_cp, OPJ_BOOL big_endian)
{
    int subsampling_dx = parameters->subsampling_dx;
    int subsampling_dy = parameters->subsampling_dy;

    FILE *f = NULL;
    int i, compno, numcomps, w, h;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t *cmptparm;
    opj_image_t * image = NULL;
    unsigned short ch;

    if ((!(raw_cp->rawWidth & raw_cp->rawHeight & raw_cp->rawComp &
            raw_cp->rawBitDepth)) == 0) {
        fprintf(stderr, "\nError: invalid raw image parameters\n");
        fprintf(stderr, "Please use the Format option -F:\n");
        fprintf(stderr,
                "-F <width>,<height>,<ncomp>,<bitdepth>,{s,u}@<dx1>x<dy1>:...:<dxn>x<dyn>\n");
        fprintf(stderr,
                "If subsampling is omitted, 1x1 is assumed for all components\n");
        fprintf(stderr,
                "Example: -i image.raw -o image.j2k -F 512,512,3,8,u@1x1:2x2:2x2\n");
        fprintf(stderr, "         for raw 512x512 image with 4:2:0 subsampling\n");
        fprintf(stderr, "Aborting.\n");
        return NULL;
    }

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        fprintf(stderr, "Aborting\n");
        return NULL;
    }
    numcomps = raw_cp->rawComp;

    /* FIXME ADE at this point, tcp_mct has not been properly set in calling function */
    if (numcomps == 1) {
        color_space = OPJ_CLRSPC_GRAY;
    } else if ((numcomps >= 3) && (parameters->tcp_mct == 0)) {
        color_space = OPJ_CLRSPC_SYCC;
    } else if ((numcomps >= 3) && (parameters->tcp_mct != 2)) {
        color_space = OPJ_CLRSPC_SRGB;
    } else {
        color_space = OPJ_CLRSPC_UNKNOWN;
    }
    w = raw_cp->rawWidth;
    h = raw_cp->rawHeight;
    cmptparm = (opj_image_cmptparm_t*) calloc((OPJ_UINT32)numcomps,
               sizeof(opj_image_cmptparm_t));
    if (!cmptparm) {
        fprintf(stderr, "Failed to allocate image components parameters !!\n");
        fprintf(stderr, "Aborting\n");
        fclose(f);
        return NULL;
    }
    /* initialize image components */
    for (i = 0; i < numcomps; i++) {
        cmptparm[i].prec = (OPJ_UINT32)raw_cp->rawBitDepth;
        cmptparm[i].sgnd = (OPJ_UINT32)raw_cp->rawSigned;
        cmptparm[i].dx = (OPJ_UINT32)(subsampling_dx * raw_cp->rawComps[i].dx);
        cmptparm[i].dy = (OPJ_UINT32)(subsampling_dy * raw_cp->rawComps[i].dy);
        cmptparm[i].w = (OPJ_UINT32)w;
        cmptparm[i].h = (OPJ_UINT32)h;
    }
    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);
    free(cmptparm);
    if (!image) {
        fclose(f);
        return NULL;
    }
    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = (OPJ_UINT32)parameters->image_offset_x0 + (OPJ_UINT32)(w - 1) *
                (OPJ_UINT32)subsampling_dx + 1;
    image->y1 = (OPJ_UINT32)parameters->image_offset_y0 + (OPJ_UINT32)(h - 1) *
                (OPJ_UINT32)subsampling_dy + 1;

    if (raw_cp->rawBitDepth <= 8) {
        unsigned char value = 0;
        for (compno = 0; compno < numcomps; compno++) {
            int nloop = (w * h) / (raw_cp->rawComps[compno].dx *
                                   raw_cp->rawComps[compno].dy);
            for (i = 0; i < nloop; i++) {
                if (!fread(&value, 1, 1, f)) {
                    fprintf(stderr, "Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                image->comps[compno].data[i] = raw_cp->rawSigned ? (char)value : value;
            }
        }
    } else if (raw_cp->rawBitDepth <= 16) {
        unsigned short value;
        for (compno = 0; compno < numcomps; compno++) {
            int nloop = (w * h) / (raw_cp->rawComps[compno].dx *
                                   raw_cp->rawComps[compno].dy);
            for (i = 0; i < nloop; i++) {
                unsigned char temp1;
                unsigned char temp2;
                if (!fread(&temp1, 1, 1, f)) {
                    fprintf(stderr, "Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&temp2, 1, 1, f)) {
                    fprintf(stderr, "Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (big_endian) {
                    value = (unsigned short)((temp1 << 8) + temp2);
                } else {
                    value = (unsigned short)((temp2 << 8) + temp1);
                }
                image->comps[compno].data[i] = raw_cp->rawSigned ? (short)value : value;
            }
        }
    } else {
        fprintf(stderr,
                "OpenJPEG cannot encode raw components with bit depth higher than 16 bits.\n");
        opj_image_destroy(image);
        fclose(f);
        return NULL;
    }

    if (fread(&ch, 1, 1, f)) {
        fprintf(stderr, "Warning. End of raw file not reached... processing anyway\n");
    }
    fclose(f);

    return image;
}